

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::operator*=(Matrix33<float> *this,Matrix33<float> *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Matrix33<float> local_38;
  
  uVar7 = *(undefined8 *)(v->x[0] + 1);
  uVar8 = *(undefined8 *)(v->x[1] + 1);
  uVar9 = *(undefined8 *)(v->x[2] + 1);
  fVar1 = v->x[1][0];
  fVar14 = (float)uVar8;
  fVar15 = (float)((ulong)uVar8 >> 0x20);
  fVar2 = this->x[1][1];
  fVar16 = (float)*(undefined8 *)(this->x[0] + 1);
  fVar3 = this->x[1][0];
  fVar17 = (float)*(undefined8 *)this->x[0];
  fVar4 = v->x[0][0];
  fVar10 = (float)uVar7;
  fVar11 = (float)((ulong)uVar7 >> 0x20);
  fVar5 = this->x[1][2];
  fVar18 = (float)*(undefined8 *)(this->x[0] + 2);
  fVar6 = v->x[2][0];
  fVar12 = (float)uVar9;
  fVar13 = (float)((ulong)uVar9 >> 0x20);
  local_38.x[0][0] = fVar6 * fVar18 + fVar4 * fVar17 + fVar16 * fVar1;
  local_38.x[0][1] = fVar12 * fVar18 + fVar10 * fVar17 + fVar16 * fVar14;
  local_38.x[0][2] = fVar13 * fVar18 + fVar11 * fVar17 + fVar16 * fVar15;
  local_38.x[1][0] = fVar6 * fVar5 + fVar4 * fVar3 + fVar2 * fVar1;
  fVar16 = this->x[2][0];
  fVar17 = this->x[2][1];
  fVar18 = this->x[2][2];
  local_38.x[1][1] = fVar12 * fVar5 + fVar10 * fVar3 + fVar2 * fVar14;
  local_38.x[2][0] = fVar6 * fVar18 + fVar4 * fVar16 + fVar17 * fVar1;
  local_38.x[1][2] = fVar13 * fVar5 + fVar11 * fVar3 + fVar2 * fVar15;
  local_38.x[2][1] = fVar12 * fVar18 + fVar10 * fVar16 + fVar17 * fVar14;
  local_38.x[2][2] = fVar13 * fVar18 + fVar11 * fVar16 + fVar15 * fVar17;
  operator=(this,&local_38);
  return this;
}

Assistant:

const Matrix33<T>&
Matrix33<T>::operator*= (const Matrix33<T>& v) IMATH_NOEXCEPT
{
    // Avoid initializing with 0 values before immediately overwriting them,
    // and unroll all loops for the best autovectorization.
    Matrix33 tmp (IMATH_INTERNAL_NAMESPACE::UNINITIALIZED);

    tmp.x[0][0] =
        x[0][0] * v.x[0][0] + x[0][1] * v.x[1][0] + x[0][2] * v.x[2][0];
    tmp.x[0][1] =
        x[0][0] * v.x[0][1] + x[0][1] * v.x[1][1] + x[0][2] * v.x[2][1];
    tmp.x[0][2] =
        x[0][0] * v.x[0][2] + x[0][1] * v.x[1][2] + x[0][2] * v.x[2][2];

    tmp.x[1][0] =
        x[1][0] * v.x[0][0] + x[1][1] * v.x[1][0] + x[1][2] * v.x[2][0];
    tmp.x[1][1] =
        x[1][0] * v.x[0][1] + x[1][1] * v.x[1][1] + x[1][2] * v.x[2][1];
    tmp.x[1][2] =
        x[1][0] * v.x[0][2] + x[1][1] * v.x[1][2] + x[1][2] * v.x[2][2];

    tmp.x[2][0] =
        x[2][0] * v.x[0][0] + x[2][1] * v.x[1][0] + x[2][2] * v.x[2][0];
    tmp.x[2][1] =
        x[2][0] * v.x[0][1] + x[2][1] * v.x[1][1] + x[2][2] * v.x[2][1];
    tmp.x[2][2] =
        x[2][0] * v.x[0][2] + x[2][1] * v.x[1][2] + x[2][2] * v.x[2][2];

    *this = tmp;
    return *this;
}